

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::emit_specialization_constants_and_structs(CompilerMSL *this)

{
  ParsedIR *this_00;
  bool bVar1;
  uint uVar2;
  Types TVar3;
  ID id;
  BaseType BVar4;
  size_t sVar5;
  TypedID<(spirv_cross::Types)0> *pTVar6;
  Variant *pVVar7;
  _Hash_node_base *p_Var8;
  size_t sVar9;
  __node_base _Var10;
  bool bVar11;
  bool bVar12;
  uint32_t uVar13;
  uint32_t id_00;
  SPIRType *pSVar14;
  SPIRConstant *pSVar15;
  size_type sVar16;
  SPIRUndef *pSVar17;
  SPIRConstantOp *pSVar18;
  ulong uVar19;
  SPIRVariable *pSVar20;
  size_type sVar21;
  mapped_type *pmVar22;
  SPIRType *pSVar23;
  long *plVar24;
  size_type *psVar25;
  _Alloc_hider _Var26;
  string *ts_1;
  byte bVar27;
  undefined4 uVar28;
  long lVar29;
  uint32_t constant_id;
  string sc_tmp_name;
  string sc_type_name;
  string sc_name;
  string local_150;
  undefined4 local_12c;
  unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
  unique_func_constants;
  LoopLock loop_lock;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  declared_structs;
  string local_a0;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  aligned_structs;
  
  wg_x.id.id = 0;
  wg_y.id.id = 0;
  wg_z.id.id = 0;
  uVar13 = Compiler::get_work_group_size_specialization_constants
                     ((Compiler *)this,&wg_x,&wg_y,&wg_z);
  declared_structs._M_h._M_buckets = &declared_structs._M_h._M_single_bucket;
  declared_structs._M_h._M_bucket_count = 1;
  declared_structs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  declared_structs._M_h._M_element_count = 0;
  declared_structs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  declared_structs._M_h._M_rehash_policy._M_next_resize = 0;
  declared_structs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  aligned_structs._M_h._M_buckets = &aligned_structs._M_h._M_single_bucket;
  aligned_structs._M_h._M_bucket_count = 1;
  aligned_structs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  aligned_structs._M_h._M_element_count = 0;
  aligned_structs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  aligned_structs._M_h._M_rehash_policy._M_next_resize = 0;
  aligned_structs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(this_00);
  sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar5 != 0) {
    pTVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar29 = 0;
    do {
      uVar2 = *(uint *)((long)&pTVar6->id + lVar29);
      pVVar7 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (((pVVar7[uVar2].type == TypeType) &&
          (pSVar14 = Variant::get<spirv_cross::SPIRType>(pVVar7 + uVar2),
          pSVar14->basetype == Struct)) &&
         (bVar11 = Compiler::has_extended_decoration
                             ((Compiler *)this,uVar2,SPIRVCrossDecorationBufferBlockRepacked),
         bVar11)) {
        mark_scalar_layout_structs(this,pSVar14);
      }
      lVar29 = lVar29 + 4;
    } while (sVar5 << 2 != lVar29);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&unique_func_constants);
  ParsedIR::create_loop_hard_lock(this_00);
  sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar5 == 0) {
    uVar28 = 0;
  }
  else {
    pTVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar29 = 0;
    uVar28 = 0;
    do {
      uVar2 = *(uint *)((long)&pTVar6->id + lVar29);
      pVVar7 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar7[uVar2].type == TypeConstant) {
        pSVar15 = Variant::get<spirv_cross::SPIRConstant>(pVVar7 + uVar2);
        pSVar14 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             *(uint *)&(pSVar15->super_IVariant).field_0xc);
        bVar11 = Compiler::is_array((Compiler *)this,pSVar14);
        if (((bVar11) &&
            (bVar11 = Compiler::has_decoration
                                ((Compiler *)this,(ID)(pSVar14->super_IVariant).self.id,
                                 DecorationBlock), bVar11)) &&
           (bVar11 = Compiler::is_builtin_type((Compiler *)this,pSVar14), bVar11)) {
          uVar28 = 1;
        }
      }
      lVar29 = lVar29 + 4;
    } while (sVar5 << 2 != lVar29);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&unique_func_constants);
  ParsedIR::create_loop_soft_lock(this_00);
  ParsedIR::create_loop_hard_lock(this_00);
  sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_12c = uVar28;
  if (sVar5 == 0) {
    ParsedIR::LoopLock::~LoopLock((LoopLock *)&sc_type_name);
    _Var10 = declared_structs._M_h._M_before_begin;
  }
  else {
    pTVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar29 = 0;
    bVar11 = false;
    do {
      uVar2 = *(uint *)((long)&pTVar6->id + lVar29);
      pVVar7 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (((pVVar7[uVar2].type == TypeType) &&
          (pSVar14 = Variant::get<spirv_cross::SPIRType>(pVVar7 + uVar2),
          pSVar14->basetype == Struct)) &&
         ((pSVar14->pointer == true && (pSVar14->storage == StorageClassPhysicalStorageBuffer)))) {
        unique_func_constants._M_h._M_buckets =
             (__buckets_ptr)
             CONCAT44(unique_func_constants._M_h._M_buckets._4_4_,(pSVar14->super_IVariant).self.id)
        ;
        sVar16 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&declared_structs._M_h,(key_type_conflict *)&unique_func_constants);
        if (sVar16 == 0) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&unique_func_constants,this,(ulong)(pSVar14->super_IVariant).self.id,1);
          CompilerGLSL::statement<char_const(&)[8],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [8])"struct ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &unique_func_constants,(char (*) [2])0x313c50);
          if ((__node_base *)unique_func_constants._M_h._M_buckets !=
              &unique_func_constants._M_h._M_before_begin) {
            operator_delete(unique_func_constants._M_h._M_buckets);
          }
          sc_name._M_dataplus._M_p._0_4_ = (pSVar14->super_IVariant).self.id;
          unique_func_constants._M_h._M_buckets = (__buckets_ptr)&declared_structs;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)unique_func_constants._M_h._M_buckets,&sc_name,&unique_func_constants);
          bVar11 = true;
        }
      }
      lVar29 = lVar29 + 4;
    } while (sVar5 << 2 != lVar29);
    ParsedIR::LoopLock::~LoopLock((LoopLock *)&sc_type_name);
    _Var10 = declared_structs._M_h._M_before_begin;
    if (bVar11) {
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2f08f5);
      _Var10 = declared_structs._M_h._M_before_begin;
    }
  }
  while (_Var10._M_nxt != (_Hash_node_base *)0x0) {
    p_Var8 = (_Var10._M_nxt)->_M_nxt;
    operator_delete(_Var10._M_nxt);
    _Var10._M_nxt = p_Var8;
  }
  memset(declared_structs._M_h._M_buckets,0,declared_structs._M_h._M_bucket_count << 3);
  declared_structs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  declared_structs._M_h._M_element_count = 0;
  unique_func_constants._M_h._M_buckets = &unique_func_constants._M_h._M_single_bucket;
  unique_func_constants._M_h._M_bucket_count = 1;
  unique_func_constants._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unique_func_constants._M_h._M_element_count = 0;
  unique_func_constants._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  unique_func_constants._M_h._M_rehash_policy._M_next_resize = 0;
  unique_func_constants._M_h._M_single_bucket = (__node_base_ptr)0x0;
  sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_constant_undef_or_type.
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar5 != 0) {
    pTVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_constant_undef_or_type.
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar29 = 0;
    bVar11 = false;
    do {
      pVVar7 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr + *(uint *)((long)&pTVar6->id + lVar29);
      TVar3 = pVVar7->type;
      if ((int)TVar3 < 9) {
        if (TVar3 == TypeType) {
          pSVar14 = Variant::get<spirv_cross::SPIRType>(pVVar7);
          id.id = (pSVar14->super_IVariant).self.id;
          BVar4 = pSVar14->basetype;
          sVar9 = (pSVar14->array).super_VectorView<unsigned_int>.buffer_size;
          bVar1 = pSVar14->pointer;
          bVar12 = Compiler::has_decoration((Compiler *)this,id,DecorationBlock);
          if ((bVar12) ||
             (bVar12 = Compiler::has_decoration
                                 ((Compiler *)this,(ID)(pSVar14->super_IVariant).self.id,
                                  DecorationBufferBlock), bVar12)) {
            bVar12 = Compiler::is_builtin_type((Compiler *)this,pSVar14);
          }
          else {
            bVar12 = false;
          }
          bVar27 = (byte)local_12c;
          if (bVar12 == false) {
            bVar27 = 1;
          }
          if ((BVar4 != Struct || sVar9 != 0) || (bVar1 & 1U) != 0) {
            bVar27 = 0;
          }
          uVar19 = (ulong)(this->stage_out_var_id).id;
          if (uVar19 != 0) {
            pSVar20 = Variant::get<spirv_cross::SPIRVariable>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + uVar19);
            pSVar23 = Compiler::get_variable_data_type((Compiler *)this,pSVar20);
            if ((pSVar23->super_IVariant).self.id == id.id) {
              bVar27 = 0;
            }
          }
          uVar19 = (ulong)(this->patch_stage_out_var_id).id;
          if (uVar19 != 0) {
            pSVar20 = Variant::get<spirv_cross::SPIRVariable>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + uVar19);
            pSVar23 = Compiler::get_variable_data_type((Compiler *)this,pSVar20);
            if ((pSVar23->super_IVariant).self.id == id.id) {
              bVar27 = 0;
            }
          }
          uVar19 = (ulong)(this->stage_in_var_id).id;
          if (uVar19 != 0) {
            pSVar20 = Variant::get<spirv_cross::SPIRVariable>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + uVar19);
            pSVar23 = Compiler::get_variable_data_type((Compiler *)this,pSVar20);
            if ((pSVar23->super_IVariant).self.id == id.id) {
              bVar27 = 0;
            }
          }
          uVar19 = (ulong)(this->patch_stage_in_var_id).id;
          if (uVar19 != 0) {
            pSVar20 = Variant::get<spirv_cross::SPIRVariable>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + uVar19);
            pSVar23 = Compiler::get_variable_data_type((Compiler *)this,pSVar20);
            if ((pSVar23->super_IVariant).self.id == id.id) {
              bVar27 = 0;
            }
          }
          if (((this->stage_out_masked_builtin_type_id).id == id.id) || ((bVar27 & 1) != 0)) {
            sc_type_name._M_dataplus._M_p._0_4_ = id.id;
            sVar16 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count(&declared_structs._M_h,(key_type_conflict *)&sc_type_name);
            if (sVar16 == 0) {
              if (bVar11) {
                CompilerGLSL::statement<char_const(&)[1]>
                          (&this->super_CompilerGLSL,(char (*) [1])0x2f08f5);
              }
              sc_type_name._M_dataplus._M_p = (pointer)&declared_structs;
              sc_name._M_dataplus._M_p._0_4_ = id.id;
              ::std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)sc_type_name._M_dataplus._M_p,&sc_name,&sc_type_name);
              bVar11 = Compiler::has_extended_decoration
                                 ((Compiler *)this,id.id,SPIRVCrossDecorationBufferBlockRepacked);
              if (bVar11) {
                align_struct(this,pSVar14,&aligned_structs);
              }
              pSVar14 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr + id.id);
              CompilerGLSL::emit_struct(&this->super_CompilerGLSL,pSVar14);
              bVar11 = false;
            }
          }
        }
        else if (TVar3 == TypeConstant) {
          pSVar15 = Variant::get<spirv_cross::SPIRConstant>(pVVar7);
          if ((pSVar15->super_IVariant).self.id == uVar13) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      (&sc_type_name,this,0x19);
            pSVar15 = Variant::get<spirv_cross::SPIRConstant>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + uVar13);
            CompilerGLSL::constant_expression_abi_cxx11_
                      (&sc_name,&this->super_CompilerGLSL,pSVar15,false,false);
            CompilerGLSL::
            statement<char_const(&)[16],std::__cxx11::string,char_const(&)[21],std::__cxx11::string,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [16])"constant uint3 ",&sc_type_name,
                       (char (*) [21])" [[maybe_unused]] = ",&sc_name,(char (*) [2])0x313c50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(sc_name._M_dataplus._M_p._4_4_,sc_name._M_dataplus._M_p._0_4_) !=
                &sc_name.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(sc_name._M_dataplus._M_p._4_4_,sc_name._M_dataplus._M_p._0_4_
                                      ));
            }
            goto joined_r0x001bc904;
          }
          if (pSVar15->specialization == true) {
            pSVar14 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 *(uint *)&(pSVar15->super_IVariant).field_0xc);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&sc_type_name,this,pSVar14,0);
            CompilerGLSL::add_resource_name
                      (&this->super_CompilerGLSL,(pSVar15->super_IVariant).self.id);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&sc_name,this,(ulong)(pSVar15->super_IVariant).self.id);
            if ((((this->msl_options).msl_version < 0x27d8) ||
                (bVar11 = Compiler::has_decoration
                                    ((Compiler *)this,(ID)(pSVar15->super_IVariant).self.id,
                                     DecorationSpecId), !bVar11)) ||
               (pSVar15->is_used_as_array_length != false)) {
              bVar11 = Compiler::has_decoration
                                 ((Compiler *)this,(ID)(pSVar15->super_IVariant).self.id,
                                  DecorationSpecId);
              if (bVar11) {
                id_00 = Compiler::get_decoration
                                  ((Compiler *)this,(ID)(pSVar15->super_IVariant).self.id,
                                   DecorationSpecId);
                CompilerGLSL::constant_value_macro_name_abi_cxx11_
                          (&sc_tmp_name,&this->super_CompilerGLSL,id_00);
                ts_1 = &pSVar15->specialization_constant_macro_name;
                ::std::__cxx11::string::operator=((string *)ts_1,(string *)&sc_tmp_name);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)sc_tmp_name._M_dataplus._M_p != &sc_tmp_name.field_2) {
                  operator_delete(sc_tmp_name._M_dataplus._M_p);
                }
                CompilerGLSL::statement<char_const(&)[9],std::__cxx11::string&>
                          (&this->super_CompilerGLSL,(char (*) [9])"#ifndef ",ts_1);
                CompilerGLSL::constant_expression_abi_cxx11_
                          (&sc_tmp_name,&this->super_CompilerGLSL,pSVar15,false,false);
                CompilerGLSL::
                statement<char_const(&)[9],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string>
                          (&this->super_CompilerGLSL,(char (*) [9])"#define ",ts_1,
                           (char (*) [2])0x2f64a1,&sc_tmp_name);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)sc_tmp_name._M_dataplus._M_p != &sc_tmp_name.field_2) {
                  operator_delete(sc_tmp_name._M_dataplus._M_p);
                }
                CompilerGLSL::statement<char_const(&)[7]>
                          (&this->super_CompilerGLSL,(char (*) [7])"#endif");
                CompilerGLSL::
                statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                          (&this->super_CompilerGLSL,(char (*) [10])"constant ",&sc_type_name,
                           (char (*) [2])0x2f64a1,&sc_name,(char (*) [4])0x308aad,ts_1,
                           (char (*) [2])0x313c50);
              }
              else {
                CompilerGLSL::constant_expression_abi_cxx11_
                          (&sc_tmp_name,&this->super_CompilerGLSL,pSVar15,false,false);
                CompilerGLSL::
                statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                          (&this->super_CompilerGLSL,(char (*) [10])"constant ",&sc_type_name,
                           (char (*) [2])0x2f64a1,&sc_name,(char (*) [4])0x308aad,&sc_tmp_name,
                           (char (*) [2])0x313c50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)sc_tmp_name._M_dataplus._M_p != &sc_tmp_name.field_2) goto LAB_001bcf18;
              }
            }
            else {
              constant_id = Compiler::get_decoration
                                      ((Compiler *)this,(ID)(pSVar15->super_IVariant).self.id,
                                       DecorationSpecId);
              sVar21 = ::std::
                       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::count(&unique_func_constants._M_h,&constant_id);
              if (sVar21 == 0) {
                sc_tmp_name._M_dataplus._M_p =
                     (pointer)CONCAT44((pSVar15->super_IVariant).self.id,constant_id);
                ::std::
                _Hashtable<unsigned_int,std::pair<unsigned_int_const,spirv_cross::TypedID<(spirv_cross::Types)3>>,std::allocator<std::pair<unsigned_int_const,spirv_cross::TypedID<(spirv_cross::Types)3>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_int,spirv_cross::TypedID<(spirv_cross::Types)0>>>
                          ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,spirv_cross::TypedID<(spirv_cross::Types)3>>,std::allocator<std::pair<unsigned_int_const,spirv_cross::TypedID<(spirv_cross::Types)3>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)&unique_func_constants,&sc_tmp_name);
              }
              pmVar22 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&unique_func_constants,&constant_id);
              pSVar23 = Compiler::expression_type((Compiler *)this,pmVar22->id);
              BVar4 = pSVar23->basetype;
              pmVar22 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&unique_func_constants,&constant_id);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&local_150,this,(ulong)pmVar22->id,1);
              plVar24 = (long *)::std::__cxx11::string::append((char *)&local_150);
              sc_tmp_name._M_dataplus._M_p = (pointer)&sc_tmp_name.field_2;
              psVar25 = (size_type *)(plVar24 + 2);
              if ((size_type *)*plVar24 == psVar25) {
                sc_tmp_name.field_2._M_allocated_capacity = *psVar25;
                sc_tmp_name.field_2._8_8_ = plVar24[3];
              }
              else {
                sc_tmp_name.field_2._M_allocated_capacity = *psVar25;
                sc_tmp_name._M_dataplus._M_p = (pointer)*plVar24;
              }
              sc_tmp_name._M_string_length = plVar24[1];
              *plVar24 = (long)psVar25;
              plVar24[1] = 0;
              *(undefined1 *)(plVar24 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != &local_150.field_2) {
                operator_delete(local_150._M_dataplus._M_p);
              }
              pmVar22 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&unique_func_constants,&constant_id);
              if (pmVar22->id == (pSVar15->super_IVariant).self.id) {
                CompilerGLSL::
                statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[22],unsigned_int&,char_const(&)[5]>
                          (&this->super_CompilerGLSL,(char (*) [10])"constant ",&sc_type_name,
                           (char (*) [2])0x2f64a1,&sc_tmp_name,(char (*) [22])0x2fcbd7,&constant_id,
                           (char (*) [5])")]];");
              }
              CompilerGLSL::bitcast_expression
                        (&local_150,&this->super_CompilerGLSL,pSVar14,BVar4,&sc_tmp_name);
              CompilerGLSL::constant_expression_abi_cxx11_
                        (&local_a0,&this->super_CompilerGLSL,pSVar15,false,false);
              CompilerGLSL::
              statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[33],std::__cxx11::string&,char_const(&)[5],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                        (&this->super_CompilerGLSL,(char (*) [10])"constant ",&sc_type_name,
                         (char (*) [2])0x2f64a1,&sc_name,
                         (char (*) [33])" = is_function_constant_defined(",&sc_tmp_name,
                         (char (*) [5])0x2fcc5b,&local_150,(char (*) [4])0x3185d8,&local_a0,
                         (char (*) [2])0x313c50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != &local_150.field_2) {
                operator_delete(local_150._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)sc_tmp_name._M_dataplus._M_p != &sc_tmp_name.field_2) {
LAB_001bcf18:
                operator_delete(sc_tmp_name._M_dataplus._M_p);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(sc_name._M_dataplus._M_p._4_4_,sc_name._M_dataplus._M_p._0_4_) !=
                &sc_name.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(sc_name._M_dataplus._M_p._4_4_,sc_name._M_dataplus._M_p._0_4_
                                      ));
            }
            goto joined_r0x001bc904;
          }
        }
      }
      else {
        if (TVar3 == TypeConstantOp) {
          pSVar18 = Variant::get<spirv_cross::SPIRConstantOp>(pVVar7);
          pSVar14 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + (pSVar18->basetype).id);
          CompilerGLSL::add_resource_name
                    (&this->super_CompilerGLSL,(pSVar18->super_IVariant).self.id);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&sc_type_name,this,(ulong)(pSVar18->super_IVariant).self.id,1);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                    (&sc_name,this,pSVar14,&sc_type_name,0);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x18])
                    (&sc_tmp_name,this,pSVar18);
          CompilerGLSL::
          statement<char_const(&)[10],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [10])"constant ",&sc_name,
                     (char (*) [4])0x308aad,&sc_tmp_name,(char (*) [2])0x313c50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sc_tmp_name._M_dataplus._M_p != &sc_tmp_name.field_2) {
            operator_delete(sc_tmp_name._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(sc_name._M_dataplus._M_p._4_4_,sc_name._M_dataplus._M_p._0_4_) !=
              &sc_name.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(sc_name._M_dataplus._M_p._4_4_,sc_name._M_dataplus._M_p._0_4_))
            ;
          }
joined_r0x001bc904:
          _Var26._M_p = sc_type_name._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sc_type_name._M_dataplus._M_p != &sc_type_name.field_2) {
LAB_001bc906:
            operator_delete(_Var26._M_p);
          }
        }
        else {
          if (TVar3 != TypeUndef) goto LAB_001bc90e;
          pSVar17 = Variant::get<spirv_cross::SPIRUndef>(pVVar7);
          pSVar14 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(pSVar17->super_IVariant).field_0xc);
          if (pSVar14->basetype == Void) goto LAB_001bcf59;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&sc_tmp_name,this,(ulong)(pSVar17->super_IVariant).self.id,1);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                    (&sc_name,this,pSVar14,&sc_tmp_name);
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"constant","");
          inject_top_level_storage_qualifier(&sc_type_name,&sc_name,&local_150);
          CompilerGLSL::statement<std::__cxx11::string,char_const(&)[7]>
                    (&this->super_CompilerGLSL,&sc_type_name,(char (*) [7])" = {};");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sc_type_name._M_dataplus._M_p != &sc_type_name.field_2) {
            operator_delete(sc_type_name._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(sc_name._M_dataplus._M_p._4_4_,sc_name._M_dataplus._M_p._0_4_) !=
              &sc_name.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(sc_name._M_dataplus._M_p._4_4_,sc_name._M_dataplus._M_p._0_4_))
            ;
          }
          _Var26._M_p = sc_tmp_name._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sc_tmp_name._M_dataplus._M_p != &sc_tmp_name.field_2) goto LAB_001bc906;
        }
        bVar11 = true;
      }
LAB_001bc90e:
      lVar29 = lVar29 + 4;
    } while (sVar5 << 2 != lVar29);
    if (bVar11) {
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2f08f5);
    }
  }
LAB_001bcf59:
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&unique_func_constants._M_h);
  ParsedIR::LoopLock::~LoopLock(&loop_lock);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&aligned_structs._M_h);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&declared_structs._M_h);
  return;
}

Assistant:

void CompilerMSL::emit_specialization_constants_and_structs()
{
	SpecializationConstant wg_x, wg_y, wg_z;
	ID workgroup_size_id = get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);
	bool emitted = false;

	unordered_set<uint32_t> declared_structs;
	unordered_set<uint32_t> aligned_structs;

	// First, we need to deal with scalar block layout.
	// It is possible that a struct may have to be placed at an alignment which does not match the innate alignment of the struct itself.
	// In that case, if such a case exists for a struct, we must force that all elements of the struct become packed_ types.
	// This makes the struct alignment as small as physically possible.
	// When we actually align the struct later, we can insert padding as necessary to make the packed members behave like normally aligned types.
	ir.for_each_typed_id<SPIRType>([&](uint32_t type_id, const SPIRType &type) {
		if (type.basetype == SPIRType::Struct &&
		    has_extended_decoration(type_id, SPIRVCrossDecorationBufferBlockRepacked))
			mark_scalar_layout_structs(type);
	});

	bool builtin_block_type_is_required = false;
	// Very special case. If gl_PerVertex is initialized as an array (tessellation)
	// we have to potentially emit the gl_PerVertex struct type so that we can emit a constant LUT.
	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, SPIRConstant &c) {
		auto &type = this->get<SPIRType>(c.constant_type);
		if (is_array(type) && has_decoration(type.self, DecorationBlock) && is_builtin_type(type))
			builtin_block_type_is_required = true;
	});

	// Very particular use of the soft loop lock.
	// align_struct may need to create custom types on the fly, but we don't care about
	// these types for purpose of iterating over them in ir.ids_for_type and friends.
	auto loop_lock = ir.create_loop_soft_lock();

	// Physical storage buffer pointers can have cyclical references,
	// so emit forward declarations of them before other structs.
	// Ignore type_id because we want the underlying struct type from the pointer.
	ir.for_each_typed_id<SPIRType>([&](uint32_t /* type_id */, const SPIRType &type) {
		if (type.basetype == SPIRType::Struct &&
			type.pointer && type.storage == StorageClassPhysicalStorageBuffer &&
			declared_structs.count(type.self) == 0)
		{
			statement("struct ", to_name(type.self), ";");
			declared_structs.insert(type.self);
			emitted = true;
		}
	});
	if (emitted)
		statement("");

	emitted = false;
	declared_structs.clear();

	// It is possible to have multiple spec constants that use the same spec constant ID.
	// The most common cause of this is defining spec constants in GLSL while also declaring
	// the workgroup size to use those spec constants. But, Metal forbids declaring more than
	// one variable with the same function constant ID.
	// In this case, we must only declare one variable with the [[function_constant(id)]]
	// attribute, and use its initializer to initialize all the spec constants with
	// that ID.
	std::unordered_map<uint32_t, ConstantID> unique_func_constants;

	for (auto &id_ : ir.ids_for_constant_undef_or_type)
	{
		auto &id = ir.ids[id_];

		if (id.get_type() == TypeConstant)
		{
			auto &c = id.get<SPIRConstant>();

			if (c.self == workgroup_size_id)
			{
				// TODO: This can be expressed as a [[threads_per_threadgroup]] input semantic, but we need to know
				// the work group size at compile time in SPIR-V, and [[threads_per_threadgroup]] would need to be passed around as a global.
				// The work group size may be a specialization constant.
				statement("constant uint3 ", builtin_to_glsl(BuiltInWorkgroupSize, StorageClassWorkgroup),
				          " [[maybe_unused]] = ", constant_expression(get<SPIRConstant>(workgroup_size_id)), ";");
				emitted = true;
			}
			else if (c.specialization)
			{
				auto &type = get<SPIRType>(c.constant_type);
				string sc_type_name = type_to_glsl(type);
				add_resource_name(c.self);
				string sc_name = to_name(c.self);

				// Function constants are only supported in MSL 1.2 and later.
				// If we don't support it just declare the "default" directly.
				// This "default" value can be overridden to the true specialization constant by the API user.
				// Specialization constants which are used as array length expressions cannot be function constants in MSL,
				// so just fall back to macros.
				if (msl_options.supports_msl_version(1, 2) && has_decoration(c.self, DecorationSpecId) &&
				    !c.is_used_as_array_length)
				{
					// Only scalar, non-composite values can be function constants.
					uint32_t constant_id = get_decoration(c.self, DecorationSpecId);
					if (!unique_func_constants.count(constant_id))
						unique_func_constants.insert(make_pair(constant_id, c.self));
					SPIRType::BaseType sc_tmp_type = expression_type(unique_func_constants[constant_id]).basetype;
					string sc_tmp_name = to_name(unique_func_constants[constant_id]) + "_tmp";
					if (unique_func_constants[constant_id] == c.self)
						statement("constant ", sc_type_name, " ", sc_tmp_name, " [[function_constant(", constant_id,
						          ")]];");
					statement("constant ", sc_type_name, " ", sc_name, " = is_function_constant_defined(", sc_tmp_name,
					          ") ? ", bitcast_expression(type, sc_tmp_type, sc_tmp_name), " : ", constant_expression(c),
					          ";");
				}
				else if (has_decoration(c.self, DecorationSpecId))
				{
					// Fallback to macro overrides.
					c.specialization_constant_macro_name =
					    constant_value_macro_name(get_decoration(c.self, DecorationSpecId));

					statement("#ifndef ", c.specialization_constant_macro_name);
					statement("#define ", c.specialization_constant_macro_name, " ", constant_expression(c));
					statement("#endif");
					statement("constant ", sc_type_name, " ", sc_name, " = ", c.specialization_constant_macro_name,
					          ";");
				}
				else
				{
					// Composite specialization constants must be built from other specialization constants.
					statement("constant ", sc_type_name, " ", sc_name, " = ", constant_expression(c), ";");
				}
				emitted = true;
			}
		}
		else if (id.get_type() == TypeConstantOp)
		{
			auto &c = id.get<SPIRConstantOp>();
			auto &type = get<SPIRType>(c.basetype);
			add_resource_name(c.self);
			auto name = to_name(c.self);
			statement("constant ", variable_decl(type, name), " = ", constant_op_expression(c), ";");
			emitted = true;
		}
		else if (id.get_type() == TypeType)
		{
			// Output non-builtin interface structs. These include local function structs
			// and structs nested within uniform and read-write buffers.
			auto &type = id.get<SPIRType>();
			TypeID type_id = type.self;

			bool is_struct = (type.basetype == SPIRType::Struct) && type.array.empty() && !type.pointer;
			bool is_block =
			    has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);

			bool is_builtin_block = is_block && is_builtin_type(type);
			bool is_declarable_struct = is_struct && (!is_builtin_block || builtin_block_type_is_required);

			// We'll declare this later.
			if (stage_out_var_id && get_stage_out_struct_type().self == type_id)
				is_declarable_struct = false;
			if (patch_stage_out_var_id && get_patch_stage_out_struct_type().self == type_id)
				is_declarable_struct = false;
			if (stage_in_var_id && get_stage_in_struct_type().self == type_id)
				is_declarable_struct = false;
			if (patch_stage_in_var_id && get_patch_stage_in_struct_type().self == type_id)
				is_declarable_struct = false;

			// Special case. Declare builtin struct anyways if we need to emit a threadgroup version of it.
			if (stage_out_masked_builtin_type_id == type_id)
				is_declarable_struct = true;

			// Align and emit declarable structs...but avoid declaring each more than once.
			if (is_declarable_struct && declared_structs.count(type_id) == 0)
			{
				if (emitted)
					statement("");
				emitted = false;

				declared_structs.insert(type_id);

				if (has_extended_decoration(type_id, SPIRVCrossDecorationBufferBlockRepacked))
					align_struct(type, aligned_structs);

				// Make sure we declare the underlying struct type, and not the "decorated" type with pointers, etc.
				emit_struct(get<SPIRType>(type_id));
			}
		}
		else if (id.get_type() == TypeUndef)
		{
			auto &undef = id.get<SPIRUndef>();
			auto &type = get<SPIRType>(undef.basetype);
			// OpUndef can be void for some reason ...
			if (type.basetype == SPIRType::Void)
				return;

			// Undefined global memory is not allowed in MSL.
			// Declare constant and init to zeros. Use {}, as global constructors can break Metal.
			statement(
			    inject_top_level_storage_qualifier(variable_decl(type, to_name(undef.self), undef.self), "constant"),
			    " = {};");
			emitted = true;
		}
	}

	if (emitted)
		statement("");
}